

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O0

void resize(lua_State *L,Table *t,int nasize,int nhsize)

{
  byte bVar1;
  int iVar2;
  Node *block;
  TValue *pTVar3;
  Node *pNVar4;
  TValue *pTVar5;
  TValue *local_68;
  TValue *o1_1;
  TValue *o2_1;
  Node *old;
  TValue *o1;
  TValue *o2;
  Node *nold;
  int oldhsize;
  int oldasize;
  int i;
  int nhsize_local;
  int nasize_local;
  Table *t_local;
  lua_State *L_local;
  
  iVar2 = t->sizearray;
  bVar1 = t->lsizenode;
  block = t->node;
  if (iVar2 < nasize) {
    setarrayvector(L,t,nasize);
  }
  setnodevector(L,t,nhsize);
  if (nasize < iVar2) {
    t->sizearray = nasize;
    for (oldhsize = nasize; oldhsize < iVar2; oldhsize = oldhsize + 1) {
      if (t->array[oldhsize].tt != 0) {
        pTVar5 = t->array;
        pTVar3 = luaH_setnum(L,t,oldhsize + 1);
        pTVar3->value = pTVar5[oldhsize].value;
        pTVar3->tt = pTVar5[oldhsize].tt;
      }
    }
    if ((ulong)(long)(nasize + 1) < 0x1000000000000000) {
      local_68 = (TValue *)luaM_realloc_(L,t->array,(long)iVar2 << 4,(long)nasize << 4);
    }
    else {
      local_68 = (TValue *)luaM_toobig(L);
    }
    t->array = local_68;
  }
  oldhsize = 1 << (bVar1 & 0x1f);
  while (oldhsize = oldhsize + -1, -1 < oldhsize) {
    pNVar4 = block + oldhsize;
    if ((pNVar4->i_val).tt != 0) {
      pTVar5 = luaH_set(L,t,&(pNVar4->i_key).tvk);
      pTVar5->value = (pNVar4->i_val).value;
      pTVar5->tt = (pNVar4->i_val).tt;
    }
  }
  if (block != &dummynode_) {
    luaM_realloc_(L,block,(long)(1 << (bVar1 & 0x1f)) * 0x28,0);
  }
  return;
}

Assistant:

static void resize (lua_State *L, Table *t, int nasize, int nhsize) {
  int i;
  int oldasize = t->sizearray;
  int oldhsize = t->lsizenode;
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  setnodevector(L, t, nhsize);  
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        setobjt2t(L, luaH_setnum(L, t, i+1), &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (i = twoto(oldhsize) - 1; i >= 0; i--) {
    Node *old = nold+i;
    if (!ttisnil(gval(old)))
      setobjt2t(L, luaH_set(L, t, key2tval(old)), gval(old));
  }
  if (nold != dummynode)
    luaM_freearray(L, nold, twoto(oldhsize), Node);  /* free old array */
}